

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc)

{
  ostream *poVar1;
  RuntimeError *__return_storage_ptr___00;
  Type t;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  if (*(int *)(this + 0x40) == 0x13) {
    std::__cxx11::u32string::u32string
              ((u32string *)__return_storage_ptr__,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               (*(long *)(this + 0x48) + 0x10));
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"expected string result, got: ");
  type_str_abi_cxx11_(&sStack_1c8,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 0x40),t);
  std::operator<<(poVar1,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  anon_unknown_0::Stack::makeError(__return_storage_ptr___00,(Stack *)(this + 0x50),loc,&sStack_1c8)
  ;
  __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

UString manifestString(const LocationRange &loc)
    {
        if (scratch.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string result, got: " << type_str(scratch.t);
            throw makeError(loc, ss.str());
        }
        return static_cast<HeapString *>(scratch.v.h)->value;
    }